

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  long lVar1;
  int iVar2;
  int iVar3;
  sqlite3 *in_RDX;
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  char *zSubSql;
  int rc;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffac;
  sqlite3_stmt *in_stack_ffffffffffffffb0;
  sqlite3 *in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_prepare_v2(in_RDX,(char *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                             (sqlite3_stmt **)in_stack_ffffffffffffffb8,
                             (char **)in_stack_ffffffffffffffb0);
  if (iVar2 == 0) {
    do {
      iVar2 = sqlite3_step((sqlite3_stmt *)in_RSI);
      if (iVar2 != 100) break;
      in_stack_ffffffffffffffc0 =
           (char **)sqlite3_column_text(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    } while ((in_stack_ffffffffffffffc0 == (char **)0x0) ||
            (((iVar3 = strncmp((char *)in_stack_ffffffffffffffc0,"CRE",3), iVar3 != 0 &&
              (iVar3 = strncmp((char *)in_stack_ffffffffffffffc0,"INS",3), iVar3 != 0)) ||
             (iVar2 = execSql(in_RSI,(char **)in_RDX,
                              (char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8)), iVar2 == 0))));
    if (iVar2 == 0x65) {
      iVar2 = 0;
    }
    if (iVar2 != 0) {
      sqlite3_errmsg(in_RDI);
      sqlite3SetString(in_stack_ffffffffffffffc0,in_RDI,(char *)in_RSI);
      in_stack_ffffffffffffffb8 = in_RDI;
    }
    sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    /* The secondary SQL must be one of CREATE TABLE, CREATE INDEX,
    ** or INSERT.  Historically there have been attacks that first
    ** corrupt the sqlite_schema.sql field with other kinds of statements
    ** then run VACUUM to get those statements to execute at inappropriate
    ** times. */
    if( zSubSql
     && (strncmp(zSubSql,"CRE",3)==0 || strncmp(zSubSql,"INS",3)==0)
    ){
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}